

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idaSlCrank_dns.c
# Opt level: O0

int ressc(sunrealtype tres,N_Vector yy,N_Vector yp,N_Vector rr,void *user_data)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double *pdVar12;
  double *pdVar13;
  double *pdVar14;
  undefined8 *in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  sunrealtype c2;
  sunrealtype s2;
  sunrealtype c1;
  sunrealtype s1;
  sunrealtype mu2;
  sunrealtype mu1;
  sunrealtype lam2;
  sunrealtype lam1;
  sunrealtype pd;
  sunrealtype xd;
  sunrealtype qd;
  sunrealtype p;
  sunrealtype x;
  sunrealtype q;
  sunrealtype *rval;
  sunrealtype *ypval;
  sunrealtype *yval;
  sunrealtype J2;
  sunrealtype m2;
  sunrealtype J1;
  sunrealtype a;
  sunrealtype Q [3];
  UserData data;
  UserData data_00;
  sunrealtype *in_stack_ffffffffffffffb8;
  N_Vector in_stack_ffffffffffffffc0;
  double local_38;
  
  data_00 = (UserData)*in_RCX;
  dVar1 = (double)in_RCX[1];
  dVar2 = (double)in_RCX[3];
  dVar3 = (double)in_RCX[2];
  pdVar12 = (double *)N_VGetArrayPointer(in_RDI);
  pdVar13 = (double *)N_VGetArrayPointer(in_RSI);
  pdVar14 = (double *)N_VGetArrayPointer(in_RDX);
  dVar16 = *pdVar12;
  dVar4 = pdVar12[1];
  dVar18 = pdVar12[2];
  dVar5 = pdVar12[3];
  dVar6 = pdVar12[4];
  dVar7 = pdVar12[5];
  dVar8 = pdVar12[6];
  dVar9 = pdVar12[7];
  dVar10 = pdVar12[8];
  dVar11 = pdVar12[9];
  dVar15 = sin(dVar16);
  dVar16 = cos(dVar16);
  dVar17 = sin(dVar18);
  dVar18 = cos(dVar18);
  force(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,data_00);
  *pdVar14 = -((double)data_00 * dVar16) * dVar11 +
             (double)data_00 * dVar15 * dVar10 + (*pdVar13 - dVar5);
  pdVar14[1] = (pdVar13[1] - dVar6) + dVar10;
  pdVar14[2] = -dVar18 * dVar11 + dVar17 * dVar10 + (pdVar13[2] - dVar7);
  pdVar14[3] = -((double)data_00 * dVar16) * dVar9 +
               (double)data_00 * dVar15 * dVar8 +
               dVar1 * pdVar13[3] + -(double)in_stack_ffffffffffffffb8;
  pdVar14[4] = dVar2 * pdVar13[4] + -(double)in_stack_ffffffffffffffc0 + dVar8;
  pdVar14[5] = -dVar18 * dVar9 + dVar17 * dVar8 + dVar3 * pdVar13[5] + -local_38;
  pdVar14[6] = -(double)data_00 * dVar16 + (dVar4 - dVar18);
  pdVar14[7] = -(double)data_00 * dVar15 + -dVar17;
  pdVar14[8] = dVar17 * dVar7 + (double)data_00 * dVar15 * dVar5 + dVar6;
  pdVar14[9] = -(double)data_00 * dVar16 * dVar5 + -(dVar18 * dVar7);
  return 0;
}

Assistant:

int ressc(sunrealtype tres, N_Vector yy, N_Vector yp, N_Vector rr, void* user_data)
{
  UserData data;
  sunrealtype Q[3];
  sunrealtype a, J1, m2, J2;
  sunrealtype *yval, *ypval, *rval;
  sunrealtype q, x, p;
  sunrealtype qd, xd, pd;
  sunrealtype lam1, lam2, mu1, mu2;
  sunrealtype s1, c1, s2, c2;

  data = (UserData)user_data;

  a  = data->a;
  J1 = data->J1;
  m2 = data->m2;
  J2 = data->J2;

  yval  = N_VGetArrayPointer(yy);
  ypval = N_VGetArrayPointer(yp);
  rval  = N_VGetArrayPointer(rr);

  q = yval[0];
  x = yval[1];
  p = yval[2];

  qd = yval[3];
  xd = yval[4];
  pd = yval[5];

  lam1 = yval[6];
  lam2 = yval[7];

  mu1 = yval[8];
  mu2 = yval[9];

  s1 = sin(q);
  c1 = cos(q);
  s2 = sin(p);
  c2 = cos(p);

  force(yy, Q, data);

  rval[0] = ypval[0] - qd + a * s1 * mu1 - a * c1 * mu2;
  rval[1] = ypval[1] - xd + mu1;
  rval[2] = ypval[2] - pd + s2 * mu1 - c2 * mu2;

  rval[3] = J1 * ypval[3] - Q[0] + a * s1 * lam1 - a * c1 * lam2;
  rval[4] = m2 * ypval[4] - Q[1] + lam1;
  rval[5] = J2 * ypval[5] - Q[2] + s2 * lam1 - c2 * lam2;

  rval[6] = x - c2 - a * c1;
  rval[7] = -s2 - a * s1;

  rval[8] = a * s1 * qd + xd + s2 * pd;
  rval[9] = -a * c1 * qd - c2 * pd;

  return (0);
}